

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvafucstart.c
# Opt level: O1

int main(int argc,char **argv)

{
  nva_card **ppnVar1;
  uint uVar2;
  char cVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  void *pvVar6;
  undefined4 uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  char cVar11;
  uint uVar12;
  byte bVar13;
  uint uVar14;
  bool bVar15;
  int cnum;
  int local_48;
  uint local_44;
  ulong local_40;
  ulong local_38;
  
  iVar4 = nva_init();
  if (iVar4 == 0) {
    local_48 = 0;
    iVar4 = 0;
    uVar8 = 0;
    do {
      while( true ) {
        while( true ) {
          while (iVar5 = getopt(argc,argv,"c:bvpsou"), 0x6e < iVar5) {
            switch(iVar5) {
            case 0x6f:
              uVar8 = 0x104000;
              iVar4 = 3;
              break;
            case 0x70:
              uVar8 = 0x86000;
              iVar4 = 2;
              break;
            case 0x73:
              uVar8 = 0x87000;
              iVar4 = 5;
              break;
            case 0x75:
              uVar8 = 0x1c1000;
              iVar4 = 5;
              break;
            case 0x76:
              uVar8 = 0x85000;
              iVar4 = 4;
            }
          }
          if (iVar5 != 0x62) break;
          uVar8 = 0x84000;
          iVar4 = 6;
        }
        if (iVar5 != 99) break;
        __isoc99_sscanf(_optarg,"%d",&local_48);
      }
    } while (iVar5 != -1);
    if (local_48 < nva_cardsnum) {
      if (uVar8 == 0) {
        main_cold_5();
      }
      else if (_optind < argc) {
        __stream = fopen(argv[_optind],"rb");
        if (__stream != (FILE *)0x0) {
          fprintf(_stderr,"Uploading file %s.\n",argv[_optind]);
          pvVar6 = nva_cards[local_48]->bar0;
          *(undefined4 *)((long)pvVar6 + 0x200) = 0x40110011;
          *(undefined4 *)((long)pvVar6 + 0x200) = 0xffffffff;
          usleep(1000);
          ppnVar1 = nva_cards;
          *(undefined4 *)((long)nva_cards[local_48]->bar0 + 0x1700) = 0x100;
          lVar9 = 0;
          do {
            *(undefined4 *)((long)ppnVar1[local_48]->bar0 + lVar9 + 0x701000) = 0x190000;
            *(undefined4 *)((long)ppnVar1[local_48]->bar0 + lVar9 + 0x701004) = 0x3ffffff;
            *(undefined4 *)((long)ppnVar1[local_48]->bar0 + lVar9 + 0x701008) = 0x3000000;
            *(undefined4 *)((long)ppnVar1[local_48]->bar0 + lVar9 + 0x70100c) = 0;
            *(undefined4 *)((long)ppnVar1[local_48]->bar0 + lVar9 + 0x701010) = 0;
            *(undefined4 *)((long)ppnVar1[local_48]->bar0 + lVar9 + 0x701014) = 0;
            lVar9 = lVar9 + 0x20;
          } while (lVar9 != 0x200);
          pvVar6 = ppnVar1[local_48]->bar0;
          *(undefined4 *)((long)pvVar6 + 0x1700) = 0x300;
          *(undefined4 *)((long)pvVar6 + 0x700000) = 0;
          *(undefined4 *)((long)pvVar6 + 0x1700) = 0x200;
          uVar10 = 0xfffffffffffffffc;
          do {
            *(undefined4 *)((long)ppnVar1[local_48]->bar0 + uVar10 + 0x700004) = 0xffff06;
            uVar10 = uVar10 + 4;
          } while (uVar10 < 0xffffc);
          pvVar6 = ppnVar1[local_48]->bar0;
          uVar10 = (ulong)uVar8;
          local_44 = *(uint *)((long)pvVar6 + uVar10 + 300);
          if ((local_44 & 0xf) == 0) {
            uVar7 = 0x100000;
            lVar9 = 0xff8;
          }
          else {
            pvVar6 = ppnVar1[local_48]->bar0;
            uVar7 = 0x3000000;
            lVar9 = 0x180;
          }
          *(undefined4 *)((long)pvVar6 + lVar9 + uVar10) = uVar7;
          uVar8 = 0;
          local_40 = uVar10;
          cVar3 = '\x04';
          do {
            cVar11 = cVar3;
            local_38 = (ulong)uVar8;
            uVar8 = fgetc(__stream);
            if (uVar8 == 0xffffffff) {
              bVar15 = true;
              uVar14 = 0;
            }
            else {
              bVar13 = 0;
              uVar14 = 0;
              uVar2 = 0;
              do {
                uVar12 = uVar2;
                uVar14 = (uVar8 & 0xff) << (bVar13 & 0x1f) | uVar14;
                if (uVar12 == 3) break;
                uVar8 = fgetc(__stream);
                bVar13 = bVar13 + 8;
                uVar2 = uVar12 + 1;
              } while (uVar8 != 0xffffffff);
              bVar15 = uVar12 < 3;
              uVar10 = local_40;
            }
            if ((local_44 & 0xf) == 0) {
              lVar9 = 0xff4;
            }
            else {
              lVar9 = 0x184;
              if ((local_38 & 0xfc) == 0) {
                *(uint *)((long)nva_cards[local_48]->bar0 + uVar10 + 0x188) =
                     (uint)(local_38 >> 8) & 0xffffff;
              }
            }
            *(uint *)((long)nva_cards[local_48]->bar0 + lVar9 + uVar10) = uVar14;
            ppnVar1 = nva_cards;
            uVar8 = (int)local_38 + 4;
            cVar3 = cVar11 + '\x04';
            if (bVar15) {
              if ((local_38 & 0xfc) != 0) {
                lVar9 = 0x184;
                if ((local_44 & 0xf) == 0) {
                  lVar9 = 0xff4;
                }
                do {
                  *(undefined4 *)((long)ppnVar1[local_48]->bar0 + lVar9 + uVar10) = 0;
                  bVar15 = cVar11 != '\0';
                  cVar11 = cVar11 + '\x04';
                } while (bVar15);
              }
              pvVar6 = nva_cards[local_48]->bar0;
              *(undefined4 *)((long)pvVar6 + 0x70000) = 1;
              do {
              } while (*(int *)((long)pvVar6 + 0x70000) != 0);
              usleep(1000);
              ppnVar1 = nva_cards;
              *(undefined4 *)((long)nva_cards[local_48]->bar0 + uVar10 + 4) = 0x10;
              *(undefined4 *)((long)ppnVar1[local_48]->bar0 + uVar10 + 0x48) = 3;
              *(undefined4 *)((long)ppnVar1[local_48]->bar0 + uVar10 + 0x10c) = 1;
              *(undefined4 *)((long)ppnVar1[local_48]->bar0 + uVar10 + 0x104) = 0;
              *(undefined4 *)((long)ppnVar1[local_48]->bar0 + uVar10 + 0x100) = 2;
              pvVar6 = ppnVar1[local_48]->bar0;
              *(uint *)((long)pvVar6 + 0x1588) = *(uint *)((long)pvVar6 + 0x1588) & 0xffff0000;
              *(undefined4 *)((long)pvVar6 + 0x2500) = 1;
              *(undefined4 *)((long)pvVar6 + 0x3200) = 1;
              *(undefined4 *)((long)pvVar6 + 0x3250) = 1;
              *(undefined4 *)((long)pvVar6 + 0x1700) = 0x100;
              *(undefined4 *)((long)pvVar6 + 0x700f00) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f04) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f08) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f0c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f10) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f14) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f18) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f1c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f20) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f24) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f28) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f2c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f30) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f34) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f38) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f3c) = 0x403f6078;
              *(undefined4 *)((long)pvVar6 + 0x700f40) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f44) = 0x2101ffff;
              *(undefined4 *)((long)pvVar6 + 0x700f48) = 0x10;
              *(undefined4 *)((long)pvVar6 + 0x700f4c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f50) = 0x1010000;
              *(undefined4 *)((long)pvVar6 + 0x700f54) = 0x80000;
              *(undefined4 *)((long)pvVar6 + 0x700f58) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f5c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f60) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f64) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f68) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f6c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f70) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f74) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f78) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f7c) = 0x30000fff;
              *(undefined4 *)((long)pvVar6 + 0x700f80) = 0x4000600;
              *(undefined4 *)((long)pvVar6 + 0x700f84) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f88) = 0x4010;
              *(undefined4 *)((long)pvVar6 + 0x700f8c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f90) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f94) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700f98) = 0x1001;
              *(undefined4 *)((long)pvVar6 + 0x700e00) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e04) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e08) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e0c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e10) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e14) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e18) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e1c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e20) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e24) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e28) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e2c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e30) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e34) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e38) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e3c) = 0x403f6078;
              *(undefined4 *)((long)pvVar6 + 0x700e40) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e44) = 0x2101ffff;
              *(undefined4 *)((long)pvVar6 + 0x700e48) = 0x10;
              *(undefined4 *)((long)pvVar6 + 0x700e4c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e50) = 0x1010000;
              *(undefined4 *)((long)pvVar6 + 0x700e54) = 0x80000;
              *(undefined4 *)((long)pvVar6 + 0x700e58) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e5c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e60) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e64) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e68) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e6c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e70) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e74) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e78) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e7c) = 0x30000fff;
              *(undefined4 *)((long)pvVar6 + 0x700e80) = 0x4000600;
              *(undefined4 *)((long)pvVar6 + 0x700e84) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e88) = 0x4010;
              *(undefined4 *)((long)pvVar6 + 0x700e8c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e90) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e94) = 0;
              *(undefined4 *)((long)pvVar6 + 0x700e98) = 0x1001;
              uVar10 = 0xfffffffffffffffc;
              do {
                *(undefined4 *)((long)ppnVar1[local_48]->bar0 + uVar10 + 0x706004) = 0;
                uVar10 = uVar10 + 4;
              } while (uVar10 < 0xffd);
              pvVar6 = ppnVar1[local_48]->bar0;
              *(undefined4 *)((long)pvVar6 + 0x707008) = 1;
              *(uint *)((long)pvVar6 + 0x70700c) = iVar4 << 0x14 | 4;
              *(undefined4 *)((long)pvVar6 + 0x701100) = 0x19003d;
              *(undefined4 *)((long)pvVar6 + 0x701104) = 0xffffffff;
              *(undefined4 *)((long)pvVar6 + 0x701108) = 0;
              *(undefined4 *)((long)pvVar6 + 0x70110c) = 0;
              *(undefined4 *)((long)pvVar6 + 0x701110) = 0;
              *(undefined4 *)((long)pvVar6 + 0x701114) = 0;
              *(undefined4 *)((long)pvVar6 + 0x709000) = 1;
              *(undefined4 *)((long)pvVar6 + 0x70000) = 1;
              pvVar6 = nva_cards[local_48]->bar0;
              do {
              } while (*(int *)((long)pvVar6 + 0x70000) != 0);
              *(undefined4 *)((long)pvVar6 + 0x2600) = 0x8001000d;
              *(undefined4 *)((long)pvVar6 + 0x2604) = 0xc001000f;
              *(undefined4 *)((long)pvVar6 + 0x27fc) = 0x8001000e;
              *(undefined4 *)((long)pvVar6 + 0x32f4) = 0x1009;
              *(undefined4 *)((long)pvVar6 + 0x32ec) = 1;
              *(undefined4 *)((long)pvVar6 + 0x2500) = 0x101;
              *(undefined4 *)((long)pvVar6 + 0x720000) = 0x40000;
              *(undefined4 *)((long)pvVar6 + 0x720004) = 1;
              *(undefined4 *)((long)pvVar6 + 0x710000) = 0x1020000;
              *(undefined4 *)((long)pvVar6 + 0x710004) = 0x8000;
              *(undefined4 *)((long)pvVar6 + 0x70000) = 1;
              do {
              } while (*(int *)((long)pvVar6 + 0x70000) != 0);
              *(undefined4 *)((long)pvVar6 + 0xc0208c) = 1;
              *(undefined4 *)((long)pvVar6 + 0x1700) = 0x300;
              return 0;
            }
          } while( true );
        }
        fprintf(_stderr,"Binary file %s could not be opened.\n",argv[_optind]);
      }
      else {
        main_cold_4();
      }
    }
    else if (nva_cardsnum == 0) {
      main_cold_3();
    }
    else {
      main_cold_2();
    }
  }
  else {
    main_cold_1();
  }
  return 1;
}

Assistant:

int main(int argc, char **argv) {
	if (nva_init()) {
		fprintf (stderr, "PCI init failure!\n");
		return 1;
	}
	int c;
	int cnum =0;
	uint32_t base = 0;
	int eng = 0;
	while ((c = getopt (argc, argv, "c:bvpsou")) != -1)
		switch (c) {
			case 'c':
				sscanf(optarg, "%d", &cnum);
				break;
			case 'b':
				base = 0x84000;
				eng = 6;
				break;
			case 'v':
				base = 0x85000;
				eng = 4;
				break;
			case 'p':
				base = 0x86000;
				eng = 2;
				break;
			case 's':
				base = 0x87000;
				eng = 5;
				break;
			case 'o':
				base = 0x104000;
				eng = 3;
				break;
			case 'u':
				base = 0x1c1000;
				eng = 5;
				break;
		}
	if (cnum >= nva_cardsnum) {
		if (nva_cardsnum)
			fprintf (stderr, "No such card.\n");
		else
			fprintf (stderr, "No cards found.\n");
		return 1;
	}

	if (!base) {
		fprintf (stderr, "No engine specified. Specify -b for PVLD, -v for PVDEC, -p for PPPP, -s for PCRYPT3, -o for PCOPY\n");
		return 1;
	}

	if (optind >= argc) {
		fprintf(stderr, "At least specify payload file.\n");
		return 1;
	}

	FILE *payload = fopen(argv[optind], "rb");

	if (payload == NULL) {
		fprintf(stderr, "Binary file %s could not be opened.\n", argv[optind]);
		return 1;
	} else {
		fprintf(stderr, "Uploading file %s.\n", argv[optind]);
	}

	int32_t i;
	nva_wr32(cnum, 0x200, 0x40110011);
	nva_wr32(cnum, 0x200, 0xffffffff);
	usleep(1000);
	nva_wr32(cnum, 0x1700, 0x100);
	for (i = 0; i < 0x10; i++) {
	nva_wr32(cnum, 0x701000 + i * 0x20, 0x00190000);
	nva_wr32(cnum, 0x701004 + i * 0x20, 0x03ffffff);
	nva_wr32(cnum, 0x701008 + i * 0x20, 0x03000000);
	nva_wr32(cnum, 0x70100c + i * 0x20, 0x00000000);
	nva_wr32(cnum, 0x701010 + i * 0x20, 0x00000000);
	nva_wr32(cnum, 0x701014 + i * 0x20, 0x00000000);
	}
	nva_wr32(cnum, 0x1700, 0x300);
	nva_wr32(cnum, 0x700000, 0x00000000);
	nva_wr32(cnum, 0x1700, 0x200);
	for (i = 0; i < 0x100000; i+= 4)
		nva_wr32(cnum, 0x700000 + i, 0xffff06);
	int version = nva_rd32(cnum, base + 0x12c) & 0xf;
	if (version)
		nva_wr32(cnum, base + 0x180, 0x03000000);
	else
		nva_wr32(cnum, base + 0xff8, 0x00100000);

	for (i = 0; ; i += 4) {
		uint32_t word = 0;
		int y;
		int character = 0;
		for (y = 0; y < 4; y++) {
			character = fgetc(payload);
			if (character == EOF) {
				break;
			}
			word |= ((unsigned char)character) << (y * 8);
		}
		if (version == 0) {
			nva_wr32(cnum, base + 0xff4, word);
		}	else {
			if (!(i & 0xff))
				nva_wr32(cnum, base + 0x188, i >> 8);
			nva_wr32(cnum, base + 0x184, word);
		}
		if (character == EOF) {
			break;
		}
	}
	while (i & 0xff) {
		if (version == 0) {
			nva_wr32(cnum, base + 0xff4, 0);
		}	else {
			nva_wr32(cnum, base + 0x184, 0);
		}
		i += 4;
	}

	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	usleep(1000);
	nva_wr32(cnum, base+0x004, 0x10);
	nva_wr32(cnum, base+0x048, 3);
	nva_wr32(cnum, base+0x10c, 1);
	nva_wr32(cnum, base+0x104, 0);
	nva_wr32(cnum, base+0x100, 2);
	nva_wr32(cnum, 0x1588, nva_rd32(cnum, 0x1588) & ~0xffff);
	nva_wr32(cnum, 0x2500, 1);
	nva_wr32(cnum, 0x3200, 1);
	nva_wr32(cnum, 0x3250, 1);
	nva_wr32(cnum, 0x1700, 0x100);
	nva_wr32(cnum, 0x700000+0xf00, 0);
	nva_wr32(cnum, 0x700000+0xf04, 0);
	nva_wr32(cnum, 0x700000+0xf08, 0);
	nva_wr32(cnum, 0x700000+0xf0c, 0);
	nva_wr32(cnum, 0x700000+0xf10, 0);
	nva_wr32(cnum, 0x700000+0xf14, 0);
	nva_wr32(cnum, 0x700000+0xf18, 0);
	nva_wr32(cnum, 0x700000+0xf1c, 0);
	nva_wr32(cnum, 0x700000+0xf20, 0);
	nva_wr32(cnum, 0x700000+0xf24, 0);
	nva_wr32(cnum, 0x700000+0xf28, 0);
	nva_wr32(cnum, 0x700000+0xf2c, 0);
	nva_wr32(cnum, 0x700000+0xf30, 0);
	nva_wr32(cnum, 0x700000+0xf34, 0);
	nva_wr32(cnum, 0x700000+0xf38, 0);
	nva_wr32(cnum, 0x700000+0xf3c, 0x403f6078);
	nva_wr32(cnum, 0x700000+0xf40, 0);
	nva_wr32(cnum, 0x700000+0xf44, 0x2101ffff);
	nva_wr32(cnum, 0x700000+0xf48, 0x10);
	nva_wr32(cnum, 0x700000+0xf4c, 0);
	nva_wr32(cnum, 0x700000+0xf50, 0x1010000);
	nva_wr32(cnum, 0x700000+0xf54, 0x80000);
	nva_wr32(cnum, 0x700000+0xf58, 0);
	nva_wr32(cnum, 0x700000+0xf5c, 0);
	nva_wr32(cnum, 0x700000+0xf60, 0);
	nva_wr32(cnum, 0x700000+0xf64, 0);
	nva_wr32(cnum, 0x700000+0xf68, 0);
	nva_wr32(cnum, 0x700000+0xf6c, 0);
	nva_wr32(cnum, 0x700000+0xf70, 0);
	nva_wr32(cnum, 0x700000+0xf74, 0);
	nva_wr32(cnum, 0x700000+0xf78, 0);
	nva_wr32(cnum, 0x700000+0xf7c, 0x30000fff);
	nva_wr32(cnum, 0x700000+0xf80, 0x4000600);
	nva_wr32(cnum, 0x700000+0xf84, 0);
	nva_wr32(cnum, 0x700000+0xf88, 0x4010);
	nva_wr32(cnum, 0x700000+0xf8c, 0);
	nva_wr32(cnum, 0x700000+0xf90, 0);
	nva_wr32(cnum, 0x700000+0xf94, 0);
	nva_wr32(cnum, 0x700000+0xf98, 0x1001);

	nva_wr32(cnum, 0x700000+0xe00, 0);
	nva_wr32(cnum, 0x700000+0xe04, 0);
	nva_wr32(cnum, 0x700000+0xe08, 0);
	nva_wr32(cnum, 0x700000+0xe0c, 0);
	nva_wr32(cnum, 0x700000+0xe10, 0);
	nva_wr32(cnum, 0x700000+0xe14, 0);
	nva_wr32(cnum, 0x700000+0xe18, 0);
	nva_wr32(cnum, 0x700000+0xe1c, 0);
	nva_wr32(cnum, 0x700000+0xe20, 0);
	nva_wr32(cnum, 0x700000+0xe24, 0);
	nva_wr32(cnum, 0x700000+0xe28, 0);
	nva_wr32(cnum, 0x700000+0xe2c, 0);
	nva_wr32(cnum, 0x700000+0xe30, 0);
	nva_wr32(cnum, 0x700000+0xe34, 0);
	nva_wr32(cnum, 0x700000+0xe38, 0);
	nva_wr32(cnum, 0x700000+0xe3c, 0x403f6078);
	nva_wr32(cnum, 0x700000+0xe40, 0);
	nva_wr32(cnum, 0x700000+0xe44, 0x2101ffff);
	nva_wr32(cnum, 0x700000+0xe48, 0x10);
	nva_wr32(cnum, 0x700000+0xe4c, 0);
	nva_wr32(cnum, 0x700000+0xe50, 0x1010000);
	nva_wr32(cnum, 0x700000+0xe54, 0x80000);
	nva_wr32(cnum, 0x700000+0xe58, 0);
	nva_wr32(cnum, 0x700000+0xe5c, 0);
	nva_wr32(cnum, 0x700000+0xe60, 0);
	nva_wr32(cnum, 0x700000+0xe64, 0);
	nva_wr32(cnum, 0x700000+0xe68, 0);
	nva_wr32(cnum, 0x700000+0xe6c, 0);
	nva_wr32(cnum, 0x700000+0xe70, 0);
	nva_wr32(cnum, 0x700000+0xe74, 0);
	nva_wr32(cnum, 0x700000+0xe78, 0);
	nva_wr32(cnum, 0x700000+0xe7c, 0x30000fff);
	nva_wr32(cnum, 0x700000+0xe80, 0x4000600);
	nva_wr32(cnum, 0x700000+0xe84, 0);
	nva_wr32(cnum, 0x700000+0xe88, 0x4010);
	nva_wr32(cnum, 0x700000+0xe8c, 0);
	nva_wr32(cnum, 0x700000+0xe90, 0);
	nva_wr32(cnum, 0x700000+0xe94, 0);
	nva_wr32(cnum, 0x700000+0xe98, 0x1001);
	for (i = 0; i <= 0x1000; i+= 4)
		nva_wr32(cnum, 0x700000+0x6000 + i, 0);
	nva_wr32(cnum, 0x700000+0x7008, 0x1);
	nva_wr32(cnum, 0x700000+0x700c, 0x00000004 | eng << 20);
	nva_wr32(cnum, 0x700000+0x1100, 0x0019003d);
	nva_wr32(cnum, 0x700000+0x1104, 0xffffffff);
	nva_wr32(cnum, 0x700000+0x1108, 0);
	nva_wr32(cnum, 0x700000+0x110c, 0);
	nva_wr32(cnum, 0x700000+0x1110, 0);
	nva_wr32(cnum, 0x700000+0x1114, 0);
	nva_wr32(cnum, 0x700000+0x9000, 1);
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	nva_wr32(cnum, 0x2600, 0x8001000d);
	nva_wr32(cnum, 0x2604, 0xc001000f);
	nva_wr32(cnum, 0x27fc, 0x8001000e);
	nva_wr32(cnum, 0x32f4, 0x1009);
	nva_wr32(cnum, 0x32ec, 0x1);
	nva_wr32(cnum, 0x2500, 0x101);
	nva_wr32(cnum, 0x700000+0x20000, 0x00040000);
	nva_wr32(cnum, 0x700000+0x20004, 0x00000001);
	nva_wr32(cnum, 0x700000+0x10000, 0x01020000);
	nva_wr32(cnum, 0x700000+0x10004, 0x00008000);
	nva_wr32(cnum, 0x70000, 1);
	while (nva_rd32(cnum, 0x70000));
	nva_wr32(cnum, 0xc0208c, 1);
	nva_wr32(cnum, 0x1700, 0x300);
	return 0;
}